

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromZeroCopyStream
          (MessageLite *this,ZeroCopyInputStream *input)

{
  bool bVar1;
  CodedInputStream decoder;
  CodedInputStream local_60;
  
  io::CodedInputStream::CodedInputStream(&local_60,input);
  bVar1 = ParsePartialFromCodedStream(this,&local_60);
  io::CodedInputStream::~CodedInputStream(&local_60);
  return (bool)(bVar1 & local_60.legitimate_message_end_);
}

Assistant:

bool MessageLite::ParsePartialFromZeroCopyStream(
    io::ZeroCopyInputStream* input) {
  io::CodedInputStream decoder(input);
  return ParsePartialFromCodedStream(&decoder) &&
         decoder.ConsumedEntireMessage();
}